

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
chrono::utils::ChParserOpenSim::strToSTLVector<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ChParserOpenSim *this,char *string)

{
  allocator_type local_251;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  beg;
  undefined1 local_220 [48];
  undefined1 local_1f0 [48];
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  end;
  istringstream buf;
  
  std::__cxx11::string::string((string *)&beg,(char *)this,(allocator *)&end);
  std::__cxx11::istringstream::istringstream((istringstream *)&buf,(string *)&beg,_S_in);
  std::__cxx11::string::~string((string *)&beg);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator(&beg,(istream_type *)&buf);
  end._M_value._M_dataplus._M_p = (pointer)&end._M_value.field_2;
  end._M_stream = (istream_type *)0x0;
  end._M_value._M_string_length = 0;
  end._M_value.field_2._M_local_buf[0] = '\0';
  end._M_ok = false;
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_1f0,&beg);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_220,&end);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_1f0,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_220,&local_251);
  std::__cxx11::string::~string((string *)(local_220 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&end._M_value);
  std::__cxx11::string::~string((string *)&beg._M_value);
  std::__cxx11::istringstream::~istringstream((istringstream *)&buf);
  return __return_storage_ptr__;
}

Assistant:

static inline std::vector<T> strToSTLVector(const char* string) {
        std::istringstream buf(string);
        std::istream_iterator<T> beg(buf), end;
        return std::vector<T>(beg, end);
    }